

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::NormalizedFresnelBxDF::f
          (NormalizedFresnelBxDF *this,Vector3f *wo,Vector3f *wi,TransportMode mode)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  float fVar6;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar11 [16];
  undefined1 extraout_var [60];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  SampledSpectrum SVar17;
  float fVar7;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar8._0_12_ = ZEXT812(0);
  auVar8._12_4_ = 0;
  if (0.0 < (wo->super_Tuple3<pbrt::Vector3,_float>).z * (wi->super_Tuple3<pbrt::Vector3,_float>).z)
  {
    auVar16._0_4_ = FresnelMoment1(1.0 / this->eta);
    auVar16._4_60_ = extraout_var;
    auVar11 = auVar16._0_16_;
    fVar6 = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
    bVar4 = fVar6 < -1.0;
    auVar10 = ZEXT416((uint)fVar6);
    auVar12 = SUB6416(ZEXT464(0x3f800000),0);
    auVar8 = vminss_avx(auVar12,auVar10);
    fVar6 = (float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar8._0_4_);
    bVar5 = 0.0 < fVar6;
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx512vl(auVar10,auVar9);
    uVar1 = vcmpss_avx512f(auVar12,auVar10,1);
    bVar2 = (bool)((byte)uVar1 & 1);
    auVar10._4_12_ = auVar8._4_12_;
    fVar7 = (float)((uint)bVar5 * (int)this->eta + (uint)!bVar5 * (int)(1.0 / this->eta));
    auVar9 = ZEXT416((uint)fVar7);
    auVar10._0_4_ =
         (uint)bVar5 * (int)fVar6 +
         (uint)!bVar5 *
         ((uint)bVar4 * 0x3f800000 +
         (uint)!bVar4 * ((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * auVar8._0_4_));
    auVar8 = vfnmadd213ss_fma(auVar10,auVar10,auVar12);
    auVar8 = vmaxss_avx(auVar8,ZEXT816(0));
    if (auVar8._0_4_ < 0.0) {
      auVar13._0_4_ = sqrtf(auVar8._0_4_);
      auVar13._4_60_ = extraout_var_00;
      auVar8 = auVar13._0_16_;
      auVar11 = ZEXT416((uint)auVar16._0_4_);
      auVar16 = ZEXT464(0x3f800000);
    }
    else {
      auVar16 = ZEXT1664(auVar12);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
    }
    auVar11 = vfmadd132ss_fma(auVar11,auVar16._0_16_,ZEXT416(0xc0000000));
    auVar12._0_4_ = auVar8._0_4_ / fVar7;
    auVar12._4_12_ = auVar8._4_12_;
    fVar6 = auVar16._0_4_;
    if (auVar12._0_4_ < fVar6) {
      auVar8 = vfnmadd213ss_fma(auVar12,auVar12,ZEXT416(0x3f800000));
      auVar8 = vmaxss_avx(auVar8,ZEXT816(0) << 0x20);
      if (auVar8._0_4_ < 0.0) {
        auVar14._0_4_ = sqrtf(auVar8._0_4_);
        auVar14._4_60_ = extraout_var_01;
        auVar8 = auVar14._0_16_;
        auVar16 = ZEXT464(0x3f800000);
      }
      else {
        auVar8 = vsqrtss_avx(auVar8,auVar8);
      }
      auVar3 = vfmsub213ss_fma(auVar10,auVar9,auVar8);
      auVar12 = vfmadd213ss_fma(auVar10,auVar9,auVar8);
      auVar15._0_4_ = auVar3._0_4_ / auVar12._0_4_;
      auVar15._4_12_ = auVar3._4_12_;
      auVar12 = vfnmadd213ss_fma(auVar8,auVar9,auVar10);
      auVar8 = vfmadd213ss_fma(auVar8,auVar9,auVar10);
      fVar6 = auVar12._0_4_ / auVar8._0_4_;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),auVar15,auVar15);
      fVar6 = auVar8._0_4_ * 0.5;
    }
    auVar8._0_4_ = (auVar16._0_4_ - fVar6) / (auVar11._0_4_ * 3.1415927);
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = auVar8._0_4_;
    auVar8._12_4_ = auVar8._0_4_;
    if (mode == Radiance) {
      fVar6 = this->eta * this->eta * auVar8._0_4_;
      auVar8._4_4_ = fVar6;
      auVar8._0_4_ = fVar6;
      auVar8._8_4_ = fVar6;
      auVar8._12_4_ = fVar6;
    }
  }
  auVar9 = vshufpd_avx(auVar8,auVar8,1);
  SVar17.values.values._0_8_ = auVar8._0_8_;
  SVar17.values.values._8_8_ = auVar9._0_8_;
  return (SampledSpectrum)SVar17.values.values;
}

Assistant:

f(const Vector3f &wo, const Vector3f &wi, TransportMode mode) const {
        if (!SameHemisphere(wo, wi))
            return SampledSpectrum(0.f);
        // Compute $\Sw$ factor for BSSRDF value
        Float c = 1 - 2 * FresnelMoment1(1 / eta);
        SampledSpectrum f((1 - FrDielectric(CosTheta(wi), eta)) / (c * Pi));

        // Update BSSRDF transmission term to account for adjoint light transport
        if (mode == TransportMode::Radiance)
            f *= Sqr(eta);

        return f;
    }